

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pre-process.c
# Opt level: O1

char * show_token_sequence(dmr_C *C,token *token,int quote)

{
  long lVar1;
  char *__s;
  size_t sVar2;
  char *pcVar3;
  long lVar4;
  ulong uVar5;
  undefined1 *puVar6;
  
  if (token == (token *)0x0 && quote == 0) {
    pcVar3 = "<none>";
  }
  else {
    pcVar3 = C->preprocessor_buffer;
    lVar1 = 0x122c;
    uVar5 = 0;
    do {
      puVar6 = (undefined1 *)((long)&C->target + lVar1);
      if (token == &dmrC_eof_token_entry_) goto LAB_00120af9;
      if (quote == 0) {
        __s = dmrC_show_token(C,token);
      }
      else {
        __s = dmrC_quote_token(C,token);
      }
      sVar2 = strlen(__s);
      sVar2 = (size_t)(int)sVar2;
      lVar4 = uVar5 + lVar1 + sVar2;
      if (lVar4 < 0x322b) {
        if ((int)uVar5 != 0) {
          lVar1 = lVar1 + 1;
          *puVar6 = 0x20;
        }
        memcpy((void *)((long)&C->target + lVar1),__s,sVar2);
        lVar1 = lVar1 + sVar2;
        token = token->next;
        uVar5 = (ulong)(*(uint *)&token->pos >> 0x15 & 1);
      }
      else {
        dmrC_sparse_error(C,token->pos,"too long token expansion");
      }
    } while (lVar4 < 0x322b);
    puVar6 = (undefined1 *)((long)&C->target + lVar1);
LAB_00120af9:
    *puVar6 = 0;
  }
  return pcVar3;
}

Assistant:

static const char *show_token_sequence(struct dmr_C *C, struct token *token, int quote)
{
	char *ptr = C->preprocessor_buffer;
	int whitespace = 0;

	if (!token && !quote)
		return "<none>";
	while (!dmrC_eof_token(token)) {
		const char *val = quote ? dmrC_quote_token(C, token) : dmrC_show_token(C, token);
		int len = (int) strlen(val);

		if (ptr + whitespace + len >= C->preprocessor_buffer + sizeof C->preprocessor_buffer) {
			dmrC_sparse_error(C, token->pos, "too long token expansion");
			break;
		}

		if (whitespace)
			*ptr++ = ' ';
		memcpy(ptr, val, len);
		ptr += len;
		token = token->next;
		whitespace = token->pos.whitespace;
	}
	*ptr = 0;
	return C->preprocessor_buffer;
}